

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# some_types.h
# Opt level: O2

void hiberlite::hibernate<hiberlite::AVisitor<hiberlite::KillChildren>,std::pair<int,int>>
               (AVisitor<hiberlite::KillChildren> *ar,
               vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *v,uint param_3)

{
  pointer ppVar1;
  allocator local_b1;
  string local_b0 [32];
  collection_nvp<std::pair<int,_int>,_hiberlite::stl_stream_adapter<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  local_90;
  collection_nvp<std::pair<int,_int>,_hiberlite::stl_stream_adapter<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  local_58;
  
  std::__cxx11::string::string(local_b0,"items",&local_b1);
  ppVar1 = (v->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string((string *)&local_58,local_b0);
  local_58.stream.xx.first = 0;
  local_58.stream.xx.second = 0;
  local_58.stream.ct = v;
  local_58.stream.it._M_current = ppVar1;
  std::__cxx11::string::~string(local_b0);
  collection_nvp<std::pair<int,_int>,_hiberlite::stl_stream_adapter<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ::collection_nvp(&local_90,&local_58);
  AVisitor<hiberlite::KillChildren>::operator&(ar,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void hibernate(A& ar, std::vector<E>& v, const unsigned int)
{
	collection_nvp<E,stl_stream_adapter<E,std::vector<E> > > body( "items", stl_stream_adapter<E,std::vector<E> >(v) );
	ar & body;
}